

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O1

void vrna_params_subst(vrna_fold_compound_t *vc,vrna_param_t *parameters)

{
  vrna_param_t *__dest;
  vrna_md_t md;
  vrna_md_t local_800;
  
  if (vc != (vrna_fold_compound_t *)0x0) {
    if (vc->params != (vrna_param_t *)0x0) {
      free(vc->params);
    }
    if (parameters == (vrna_param_t *)0x0) {
      if (VRNA_FC_TYPE_COMPARATIVE < vc->type) {
        return;
      }
      vrna_md_set_default(&local_800);
      __dest = get_scaled_params(&local_800);
    }
    else {
      __dest = (vrna_param_t *)vrna_alloc(0x33ea8);
      memcpy(__dest,parameters,0x33ea8);
    }
    vc->params = __dest;
  }
  return;
}

Assistant:

PUBLIC void
vrna_params_subst(vrna_fold_compound_t  *vc,
                  vrna_param_t          *parameters)
{
  if (vc) {
    if (vc->params)
      free(vc->params);

    if (parameters) {
      vc->params = vrna_params_copy(parameters);
    } else {
      switch (vc->type) {
        case VRNA_FC_TYPE_SINGLE:     /* fall through */

        case VRNA_FC_TYPE_COMPARATIVE:
          vc->params = vrna_params(NULL);
          break;

        default:
          break;
      }
    }
  }
}